

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cc
# Opt level: O1

bool __thiscall dh::scanner::scan(scanner *this,FILE *fp)

{
  int *piVar1;
  undefined1 uVar2;
  uint uVar3;
  uint uVar4;
  ostream *this_00;
  long *plVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  char cVar9;
  int iVar10;
  bool bVar11;
  string tmp;
  undefined1 *local_298;
  long local_290;
  undefined1 local_288 [16];
  scanner *local_278;
  vector<dh::token,_std::allocator<dh::token>_> *local_270;
  token local_268;
  int local_23c;
  int *local_238;
  string local_230 [4];
  string local_1b0 [12];
  
  local_278 = this;
  destroy(this);
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
  if (fp != (FILE *)0x0) {
    do {
      do {
        uVar3 = fgetc((FILE *)fp);
      } while ((char)uVar3 == '\t');
    } while ((uVar3 & 0xff) == 0x20);
    bVar11 = (char)uVar3 == -1;
    if (!bVar11) {
      piVar1 = &local_278->line;
      local_270 = &local_278->_tokens;
      iVar10 = 0;
      uVar8 = 0;
      local_238 = piVar1;
      do {
        local_23c = uVar8 + 0x3d;
        uVar4 = uVar3;
        while( true ) {
          bVar7 = (byte)uVar4;
          iVar6 = *piVar1;
          if (bVar7 == 0xd || bVar7 == 10 && (char)uVar8 != '\r') {
            iVar6 = iVar6 + 1;
            *piVar1 = iVar6;
          }
          if (iVar10 != 5) break;
          uVar3 = uVar8 & 0xff;
          if (uVar3 < 0x5b) {
            if (uVar3 - 0x20 < 0x1f) {
              uVar2 = (*(code *)(&DAT_0012b080 + *(int *)(&DAT_0012b080 + (ulong)(uVar3 - 0x20) * 4)
                                ))(&DAT_0012b080 +
                                   *(int *)(&DAT_0012b080 + (ulong)(uVar3 - 0x20) * 4),piVar1,iVar6,
                                   bVar11);
              return (bool)uVar2;
            }
            if ((uVar3 - 9 < 2) || (uVar3 == 0xd)) goto LAB_0010b848;
LAB_0010b2c7:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"[ERROR] Unexpected Token \"",0x1a);
            local_268._val._M_dataplus._M_p._0_1_ = (char)uVar8;
            this_00 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)&local_268,1);
            std::__ostream_insert<char,std::char_traits<char>>(this_00,"\" in line ",10);
            plVar5 = (long *)std::ostream::operator<<(this_00,local_278->line);
            std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
            std::ostream::put((char)plVar5);
            std::ostream::flush();
LAB_0010b8f2:
            local_278->rightflag = false;
          }
          else {
            uVar3 = uVar3 - 0x5b;
            if (0x22 < uVar3) goto LAB_0010b2c7;
            if ((0x500000005U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
              if ((ulong)uVar3 != 0x21) goto LAB_0010b2c7;
              if (bVar7 == 0x7c) {
                local_290 = 0;
                *local_298 = 0;
                std::__cxx11::string::_M_replace((ulong)&local_298,0,(char *)0x0,0x12b29e);
                local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1b0,local_298,local_298 + local_290);
                token::token(&local_268,local_1b0,LOGICALOP,local_278->line);
                std::vector<dh::token,_std::allocator<dh::token>_>::emplace_back<dh::token>
                          (local_270,&local_268);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_268._val._M_dataplus._M_p._1_7_,
                                (char)local_268._val._M_dataplus._M_p) != &local_268._val.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_268._val._M_dataplus._M_p._1_7_,
                                           (char)local_268._val._M_dataplus._M_p));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
                  operator_delete(local_1b0[0]._M_dataplus._M_p);
                }
                local_290 = 0;
                *local_298 = 0;
                uVar4 = fgetc((FILE *)fp);
                goto LAB_0010b848;
              }
              local_290 = 0;
              *local_298 = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"[ERROR] Incompleted Logical operator \"|\"",0x28);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr," near line ",0xb);
              plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cerr,local_278->line);
              std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
              std::ostream::put((char)plVar5);
              std::ostream::flush();
              goto LAB_0010b8f2;
            }
            local_290 = 0;
            *local_298 = 0;
            std::__cxx11::string::_M_replace_aux((ulong)&local_298,0,0,'\x01');
            local_230[0]._M_dataplus._M_p = (pointer)&local_230[0].field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_230,local_298,local_298 + local_290);
            token::token(&local_268,local_230,SEPOP,local_278->line);
            std::vector<dh::token,_std::allocator<dh::token>_>::emplace_back<dh::token>
                      (local_270,&local_268);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_268._val._M_dataplus._M_p._1_7_,
                            (char)local_268._val._M_dataplus._M_p) != &local_268._val.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_268._val._M_dataplus._M_p._1_7_,
                                       (char)local_268._val._M_dataplus._M_p));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230[0]._M_dataplus._M_p != &local_230[0].field_2) {
              operator_delete(local_230[0]._M_dataplus._M_p);
            }
            local_290 = 0;
            *local_298 = 0;
          }
LAB_0010b848:
          if (((char)uVar4 == '\r') || ((uVar4 & 0xff) == 10)) {
            local_278->line = local_278->line + -1;
          }
          iVar10 = 0;
          bVar11 = (char)uVar4 == -1;
          if (bVar11) goto LAB_0010c0a0;
        }
        uVar3 = uVar4 & 0xff;
        if ((0x20 < bVar7) || (iVar10 = 0, (0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
          cVar9 = (char)&local_298;
          if ((uVar3 == 0x5f) || ((byte)((bVar7 & 0xdf) + 0xbf) < 0x1a)) {
            iVar10 = 1;
            std::__cxx11::string::push_back(cVar9);
          }
          else if ((byte)(bVar7 - 0x30) < 10) {
            iVar10 = 2;
            std::__cxx11::string::push_back(cVar9);
          }
          else if (bVar7 == 0x2e) {
            iVar10 = 3;
            std::__cxx11::string::push_back(cVar9);
          }
          else {
            iVar10 = 5;
            if (uVar3 == 0x22) {
              iVar10 = 4;
              std::__cxx11::string::push_back(cVar9);
            }
          }
        }
        uVar3 = fgetc((FILE *)fp);
        bVar11 = (char)uVar3 == -1;
        uVar8 = uVar4;
      } while (!bVar11);
    }
LAB_0010c0a0:
    (local_278->_it)._M_current =
         (local_278->_tokens).super__Vector_base<dh::token,_std::allocator<dh::token>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_278->scanflag = true;
    fclose((FILE *)fp);
  }
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  return fp != (FILE *)0x0;
}

Assistant:

bool scanner::scan(::std::FILE *fp)
{
	this->reset();

	STATE state = STATE::START;
	char cur = 0;
	char lastch = 0;
	::std::string tmp = "";

	if ( fp == NULL)
	{
		return false;
	}

	cur = ::std::fgetc(fp);
	while( cur == ' ' || cur == '\t') cur = ::std::fgetc(fp);

	// DFA implement
	while( cur != EOF)
	{
		if ( cur == '\n' && lastch != '\r')
		{
			++line;
		} else if ( cur == '\r')
		{
			++line;
		}

		// core part
		switch(state)
		{
			case STATE::START:
				if ( cur == ' ' || cur == '\t'
						|| cur == '\r' || cur == '\n')
				{
					state = STATE::START;
				} else if ( cur == '_' 
						|| ( cur >= 'a' && cur <= 'z')
						|| ( cur >= 'A' && cur <= 'Z'))
				{
					state = STATE::INID;
					tmp += cur;
				} else if ( cur >= '0' && cur <= '9')
				{
					state = STATE::ININT;
					tmp += cur;
				} else if ( cur == '\"') 
				{
					state = STATE::INSTRING;
					tmp += cur;
				} else if ( cur == '.') 
				{
					state = STATE::INFLOAT;
					tmp += cur;
				}
				else 
				{
					state = STATE::DONE;
				}
				lastch = cur;
				break;
			case INID:
				if ( cur == '_'
						|| ( cur >= 'a' && cur <= 'z')
						|| ( cur >= 'A' && cur <= 'Z')
						|| ( cur >= '0' && cur <= '9'))
				{
					state = STATE::INID;
					tmp += cur;
				} else 
				{
					state = STATE::DONE;
					
					TYPE tmp_type = TYPE::ID;
					if ( tmp == "boolean")
					{
						tmp_type = TYPE::BOOLEAN;
					} else if ( tmp == "break")
					{
						tmp_type = TYPE::BREAK;
					} else if ( tmp == "continue")
					{
						tmp_type = TYPE::CONTINUE;
					} else if ( tmp == "else")
					{
						tmp_type = TYPE::ELSE;
					} else if ( tmp == "for")
					{
						tmp_type = TYPE::FOR;
					} else if ( tmp == "float")
					{
						tmp_type = TYPE::FLOAT;
					} else if ( tmp == "if")
					{
						tmp_type = TYPE::IF;
					} else if ( tmp == "int")
					{
						tmp_type = TYPE::INT;
					} else if ( tmp == "return")
					{
						tmp_type = TYPE::RETURN;
					} else if ( tmp == "void")
					{
						tmp_type = TYPE::VOID;
					} else if ( tmp == "while")
					{
						tmp_type = TYPE::WHILE;
					} else if ( tmp == "true" || tmp == "false")
					{
						tmp_type = TYPE::NUMBOOLEAN;
					} else 
					{
						tmp_type = TYPE::ID;
					}
					_tokens.push_back( token( tmp, tmp_type, line));
					tmp.clear();
				}
				lastch = cur;
				break;
			case STATE::ININT:
				if ( cur >= '0' && cur <= '9')
				{
					tmp += cur;
					state = STATE::ININT;
				} else if ( cur == '.')
				{
					state = STATE::INFLOAT;
					tmp += cur;
				} else if ( cur == 'E' || cur == 'e')
				{
					tmp += cur;
					state = STATE::INFLOAT;
				} else 
				{
					state = STATE::DONE;
					
					_tokens.push_back( token( tmp, TYPE::NUMINT, line));
					tmp.clear();
				}
				lastch = cur;
				break;
			case STATE::INFLOAT:
				if ( lastch == '.')
				{
					if ( cur >= '0' && cur <= '9')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else 
					{
						state = STATE::DONE;

						_tokens.push_back( token( tmp, TYPE::NUMFLOAT, line));
						tmp.clear();
					}
				} else if ( lastch == 'E' || lastch == 'e')
				{
					if ( cur == '+' || cur == '-')
					{
						state = STATE::INFLOAT;
						tmp += cur;
					} else if ( cur >= '0' && cur <= '9')
					{
						state = STATE::INFLOAT;
						tmp += cur;
					} else 
					{
						state = STATE::START;
						::std::cerr << "[ERROR] Incompleted float-literal \"" 
							<< tmp
							<< "\" near line " 
							<< line << ::std::endl;
						tmp.clear();
						rightflag = false;
					}
				} else if( lastch >= '0' && lastch <= '9')
				{
					if ( cur == 'E' || cur == 'e')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else if ( cur >= '0' && cur <= '9')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else
					{
						state = STATE::DONE;
						_tokens.push_back( token( tmp, TYPE::NUMFLOAT, line));
						tmp.clear();
					}
				} else if ( lastch == '+' || lastch == '-')
				{
					if ( cur >= '0' && cur <= '9')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else 
					{
						::std::cerr << "[ERROR] Incompleted float-literal \""
							<< tmp
							<< "\" near line "
							<< line
							<< ::std::endl;
						tmp.clear();
						rightflag = false;
						state = STATE::START;
					}
				}
				lastch = cur;
				break;
			case STATE::INMULTICOMMENT:
				if ( lastch == '*' && cur == '/')
				{
					state = STATE::START;
				} else 
				{
					state = STATE::INMULTICOMMENT;
				}
				lastch = cur;
				break;
			case STATE::INSINGLECOMMENT:
				if (cur == '\r' || cur == '\n')
				{
					state = STATE::START;
				} else 
				{
					state = STATE::INSINGLECOMMENT;
				}
				lastch = cur;
				break;
			case STATE::INSTRING:
				if ( cur == '\"' && lastch != '\\')
				{
					state = STATE::START;

					_tokens.push_back( token( tmp, TYPE::STRING, line));
					tmp.clear();
				} else 
				{
					state = STATE::INSTRING;
					if ( cur != '\n' && cur != '\r')
					{
						tmp += cur;
					}
				}
				lastch = cur;
				break;
			case STATE::DONE:
				switch(lastch)
				{
					case ' ':
					case '\t':
					case '\r':
					case '\n':
						break;
					case '=':
						if ( cur == '=')
						{
							tmp.clear();
							tmp = lastch + cur;

							_tokens.push_back( token( tmp, TYPE::EQUOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							tmp = lastch;

							_tokens.push_back( token( tmp, TYPE::ASSINGOP, line));
							tmp.clear();
						}
						break;
					case '!':
						if ( cur == '=')
						{
							tmp.clear();
							tmp = "!=";

							_tokens.push_back( token( tmp, TYPE::EQUOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							tmp = lastch;

							_tokens.push_back( token( tmp, TYPE::LOGICALOP, line));
							tmp.clear();
						}
						break;
					case '>':
					case '<':
						if ( cur == '=')
						{
							tmp.clear();
							tmp = lastch + cur;

							_tokens.push_back( token( tmp, TYPE::RELOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							tmp = lastch;

							_tokens.push_back( token( tmp, TYPE::RELOP, line));
							tmp.clear();
						}
						break;
					case '|':
						if ( cur == '|')
						{
							tmp.clear();
							tmp = "||";

							_tokens.push_back( token( tmp, TYPE::LOGICALOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							::std::cerr << "[ERROR] Incompleted Logical operator \"|\""
								<< " near line " 
								<< line
								<< ::std::endl;
							rightflag = false;
						}
						break;
					case '&':
						if ( cur == '&')
						{
							tmp.clear();
							tmp = "&&";

							_tokens.push_back( token( tmp, TYPE::LOGICALOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							::std::cerr << "[ERROR] Incompleted Logical operator \"&\""
								<< " near line " 
								<< line
								<< ::std::endl;
							rightflag = false;
						}
						break;
					case '/':
						if ( cur == '/')
						{
							state = STATE::INSINGLECOMMENT;
							continue;
						} else if ( cur == '*'){
							state = STATE::INMULTICOMMENT;
							continue;
						}
					case '*':
						tmp.clear();
						tmp = lastch;
						_tokens.push_back( token( tmp, TYPE::MULOP, line));
						tmp.clear();
						break;
					case '+':
					case '-':
						tmp.clear();
						tmp = lastch;
						_tokens.push_back( token( tmp, TYPE::ADDOP, line));
						tmp.clear();
						break;
					case '{':
					case '}':
					case '[':
					case ']':
					case '(':
					case ')':
					case ',':
					case ';':
						tmp.clear();
						tmp = lastch;
						_tokens.push_back( token( tmp, TYPE::SEPOP, line));
						tmp.clear();
						break;
					default:
						::std::cerr << "[ERROR] Unexpected Token \""
							<< lastch
							<< "\" in line "
							<< line
							<< ::std::endl;
						rightflag = false;
						break;
				}
				if (cur == '\n' || cur == '\r')
				{
					--line;
				}
				state = STATE::START;
				continue;
		}
		cur = ::std::fgetc(fp);
	}
	_it = _tokens.begin();
	scanflag = true;;
	fclose(fp);
	return true;
}